

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O0

void __thiscall jrtplib::RTPTCPTransmitter::ClearDestinations(RTPTCPTransmitter *this)

{
  RTPTCPTransmitter *this_local;
  
  if (((this->m_init & 1U) != 0) && ((this->m_created & 1U) != 0)) {
    ClearDestSockets(this);
  }
  return;
}

Assistant:

void RTPTCPTransmitter::ClearDestinations()
{
	if (!m_init)
		return;
	
	MAINMUTEX_LOCK
	if (m_created)
		ClearDestSockets();
	MAINMUTEX_UNLOCK
}